

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O3

FT_Error af_face_globals_new(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  AF_Script_UniRange pAVar1;
  byte *pbVar2;
  FT_Face face_00;
  FT_UShort *gstyles;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FT_Error FVar6;
  FT_UInt32 FVar7;
  FT_UInt FVar8;
  AF_FaceGlobals globals;
  hb_font_t *phVar9;
  hb_buffer_t *phVar10;
  ulong uVar11;
  FT_ULong FVar12;
  ulong uVar13;
  long lVar14;
  FT_UShort FVar15;
  long lVar16;
  AF_StyleClassRec *pAVar17;
  AF_Script_UniRange pAVar18;
  FT_CharMap charmap;
  int iVar20;
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar40;
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar47 [16];
  FT_UInt gindex;
  uint local_5c;
  FT_UInt local_58;
  FT_UInt local_54;
  FT_CharMap local_50;
  AF_FaceGlobals *local_48;
  AF_ScriptClass local_40;
  int local_34;
  
  globals = (AF_FaceGlobals)ft_mem_alloc(face->memory,face->num_glyphs * 2 + 0x308,&local_34);
  if (local_34 == 0) {
    globals->face = face;
    globals->glyph_count = face->num_glyphs;
    globals->glyph_styles = (FT_UShort *)(globals + 1);
    globals->module = module;
    globals->stem_darkening_for_ppem = 0;
    globals->standard_vertical_width = 0;
    globals->standard_horizontal_width = 0;
    globals->darken_x = 0;
    globals->darken_y = 0;
    globals->scale_down_factor = 0;
    phVar9 = (hb_font_t *)hb_ft_font_create(face,0);
    globals->hb_font = phVar9;
    phVar10 = (hb_buffer_t *)hb_buffer_create();
    globals->hb_buf = phVar10;
    auVar5 = _DAT_00187030;
    face_00 = globals->face;
    charmap = face_00->charmap;
    gstyles = globals->glyph_styles;
    uVar11 = (ulong)(uint)globals->glyph_count;
    if (uVar11 != 0) {
      lVar16 = uVar11 - 1;
      auVar19._8_4_ = (int)lVar16;
      auVar19._0_8_ = lVar16;
      auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar13 = 0;
      auVar19 = auVar19 ^ _DAT_00187030;
      auVar22 = _DAT_0019f3b0;
      auVar23 = _DAT_0019f3c0;
      auVar24 = _DAT_0018df50;
      auVar25 = _DAT_0018d5f0;
      do {
        auVar26 = auVar25 ^ auVar5;
        iVar40 = auVar19._0_4_;
        iVar39 = -(uint)(iVar40 < auVar26._0_4_);
        iVar20 = auVar19._4_4_;
        auVar27._4_4_ = -(uint)(iVar20 < auVar26._4_4_);
        iVar44 = auVar19._8_4_;
        iVar43 = -(uint)(iVar44 < auVar26._8_4_);
        iVar21 = auVar19._12_4_;
        auVar27._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
        auVar36._4_4_ = iVar39;
        auVar36._0_4_ = iVar39;
        auVar36._8_4_ = iVar43;
        auVar36._12_4_ = iVar43;
        auVar45 = pshuflw(in_XMM11,auVar36,0xe8);
        auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar20);
        auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar47 = pshuflw(in_XMM12,auVar29,0xe8);
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar46 = pshuflw(auVar45,auVar27,0xe8);
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar46 | auVar47 & auVar45) ^ auVar26;
        auVar26 = packssdw(auVar26,auVar26);
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13) = 0x3fff;
        }
        auVar27 = auVar29 & auVar36 | auVar27;
        auVar26 = packssdw(auVar27,auVar27);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
        if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)gstyles + uVar13 + 2) = 0x3fff;
        }
        auVar26 = auVar24 ^ auVar5;
        iVar39 = -(uint)(iVar40 < auVar26._0_4_);
        auVar41._4_4_ = -(uint)(iVar20 < auVar26._4_4_);
        iVar43 = -(uint)(iVar44 < auVar26._8_4_);
        auVar41._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
        auVar28._4_4_ = iVar39;
        auVar28._0_4_ = iVar39;
        auVar28._8_4_ = iVar43;
        auVar28._12_4_ = iVar43;
        auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar20);
        auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar26 = auVar35 & auVar28 | auVar41;
        auVar26 = packssdw(auVar26,auVar26);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar3,auVar26 ^ auVar3);
        if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 4) = 0x3fff;
        }
        auVar29 = pshufhw(auVar28,auVar28,0x84);
        auVar36 = pshufhw(auVar35,auVar35,0x84);
        auVar27 = pshufhw(auVar29,auVar41,0x84);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
        auVar29 = packssdw(auVar30,auVar30);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 6) = 0x3fff;
        }
        auVar29 = auVar23 ^ auVar5;
        iVar39 = -(uint)(iVar40 < auVar29._0_4_);
        auVar32._4_4_ = -(uint)(iVar20 < auVar29._4_4_);
        iVar43 = -(uint)(iVar44 < auVar29._8_4_);
        auVar32._12_4_ = -(uint)(iVar21 < auVar29._12_4_);
        auVar37._4_4_ = iVar39;
        auVar37._0_4_ = iVar39;
        auVar37._8_4_ = iVar43;
        auVar37._12_4_ = iVar43;
        auVar26 = pshuflw(auVar26,auVar37,0xe8);
        auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar20);
        auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar21);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        in_XMM12 = pshuflw(auVar47 & auVar45,auVar31,0xe8);
        in_XMM12 = in_XMM12 & auVar26;
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar26 = pshuflw(auVar26,auVar32,0xe8);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar26 | in_XMM12) ^ auVar45;
        auVar26 = packssdw(auVar45,auVar45);
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 8) = 0x3fff;
        }
        auVar32 = auVar31 & auVar37 | auVar32;
        auVar26 = packssdw(auVar32,auVar32);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar26 = packssdw(auVar26 ^ auVar47,auVar26 ^ auVar47);
        if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 10) = 0x3fff;
        }
        auVar26 = auVar22 ^ auVar5;
        iVar40 = -(uint)(iVar40 < auVar26._0_4_);
        auVar42._4_4_ = -(uint)(iVar20 < auVar26._4_4_);
        iVar44 = -(uint)(iVar44 < auVar26._8_4_);
        auVar42._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
        auVar33._4_4_ = iVar40;
        auVar33._0_4_ = iVar40;
        auVar33._8_4_ = iVar44;
        auVar33._12_4_ = iVar44;
        auVar38._4_4_ = -(uint)(auVar26._4_4_ == iVar20);
        auVar38._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
        auVar38._0_4_ = auVar38._4_4_;
        auVar38._8_4_ = auVar38._12_4_;
        auVar42._0_4_ = auVar42._4_4_;
        auVar42._8_4_ = auVar42._12_4_;
        auVar26 = auVar38 & auVar33 | auVar42;
        auVar26 = packssdw(auVar26,auVar26);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar26 ^ auVar4,auVar26 ^ auVar4);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 0xc) = 0x3fff;
        }
        auVar26 = pshufhw(auVar33,auVar33,0x84);
        auVar27 = pshufhw(auVar38,auVar38,0x84);
        auVar29 = pshufhw(auVar26,auVar42,0x84);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar34 = (auVar29 | auVar27 & auVar26) ^ auVar34;
        auVar26 = packssdw(auVar34,auVar34);
        if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)gstyles + uVar13 + 0xe) = 0x3fff;
        }
        lVar16 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 8;
        auVar25._8_8_ = lVar16 + 8;
        lVar16 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 8;
        auVar24._8_8_ = lVar16 + 8;
        lVar16 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 8;
        auVar23._8_8_ = lVar16 + 8;
        lVar16 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 8;
        auVar22._8_8_ = lVar16 + 8;
        uVar13 = uVar13 + 0x10;
      } while ((uVar11 * 2 + 0xe & 0xfffffffffffffff0) != uVar13);
    }
    FVar6 = FT_Select_Charmap(face_00,FT_ENCODING_UNICODE);
    if (FVar6 == 0) {
      local_5c = 0xffffffff;
      pAVar17 = &af_adlm_dflt_style_class;
      lVar16 = 0;
      local_50 = charmap;
      local_48 = aglobals;
      do {
        pAVar18 = af_script_classes[pAVar17->script]->script_uni_ranges;
        if (pAVar18 != (AF_Script_UniRange)0x0) {
          if (pAVar17->coverage == AF_COVERAGE_DEFAULT) {
            if (pAVar17->script == globals->module->default_script) {
              local_5c = (uint)lVar16;
            }
            FVar7 = pAVar18->first;
            local_40 = af_script_classes[pAVar17->script];
            while (FVar15 = (FT_UShort)lVar16, FVar7 != 0) {
              FVar12 = (FT_ULong)FVar7;
              local_54 = FT_Get_Char_Index(face_00,FVar12);
              if (((local_54 != 0) &&
                  (uVar11 = (ulong)local_54, uVar11 < (ulong)globals->glyph_count)) &&
                 ((~gstyles[uVar11] & 0x3fff) == 0)) {
                gstyles[uVar11] = FVar15;
              }
              while ((FVar12 = FT_Get_Next_Char(face_00,FVar12,&local_54), local_54 != 0 &&
                     (FVar12 <= pAVar18->last))) {
                uVar11 = (ulong)local_54;
                if ((uVar11 < (ulong)globals->glyph_count) && ((~gstyles[uVar11] & 0x3fff) == 0)) {
                  gstyles[uVar11] = FVar15;
                }
              }
              pAVar1 = pAVar18 + 1;
              pAVar18 = pAVar18 + 1;
              FVar7 = pAVar1->first;
            }
            pAVar18 = local_40->script_uni_nonbase_ranges;
            FVar7 = pAVar18->first;
            while (FVar7 != 0) {
              FVar12 = (FT_ULong)FVar7;
              local_58 = FT_Get_Char_Index(face_00,FVar12);
              if (((local_58 != 0) &&
                  (uVar11 = (ulong)local_58, uVar11 < (ulong)globals->glyph_count)) &&
                 ((gstyles[uVar11] & 0x3fff) == FVar15)) {
                gstyles[uVar11] = gstyles[uVar11] | 0x4000;
              }
              while ((FVar12 = FT_Get_Next_Char(face_00,FVar12,&local_58), local_58 != 0 &&
                     (FVar12 <= pAVar18->last))) {
                uVar11 = (ulong)local_58;
                if ((uVar11 < (ulong)globals->glyph_count) && ((gstyles[uVar11] & 0x3fff) == FVar15)
                   ) {
                  gstyles[uVar11] = gstyles[uVar11] | 0x4000;
                }
              }
              pAVar1 = pAVar18 + 1;
              pAVar18 = pAVar18 + 1;
              FVar7 = pAVar1->first;
            }
          }
          else {
            af_shaper_get_coverage(globals,pAVar17,gstyles,'\0');
          }
        }
        aglobals = local_48;
        charmap = local_50;
        pAVar17 = af_style_classes[lVar16 + 1];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x54);
      pAVar17 = &af_adlm_dflt_style_class;
      lVar16 = 1;
      do {
        if (pAVar17->coverage == AF_COVERAGE_DEFAULT) {
          af_shaper_get_coverage(globals,pAVar17,gstyles,'\0');
        }
        pAVar17 = af_style_classes[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x55);
      af_shaper_get_coverage(globals,af_style_classes[local_5c],gstyles,'\x01');
      FVar12 = 0x30;
      do {
        FVar8 = FT_Get_Char_Index(face_00,FVar12);
        if ((FVar8 != 0) && ((ulong)FVar8 < (ulong)globals->glyph_count)) {
          pbVar2 = (byte *)((long)gstyles + (ulong)FVar8 * 2 + 1);
          *pbVar2 = *pbVar2 | 0x80;
        }
        FVar12 = FVar12 + 1;
      } while (FVar12 != 0x3a);
    }
    FVar8 = globals->module->fallback_style;
    if ((FVar8 != 0x3fff) && (lVar16 = globals->glyph_count, 0 < lVar16)) {
      lVar14 = 0;
      do {
        if ((~gstyles[lVar14] & 0x3fff) == 0) {
          gstyles[lVar14] = gstyles[lVar14] & 0xc000 | (ushort)FVar8;
        }
        lVar14 = lVar14 + 1;
      } while (lVar16 != lVar14);
    }
    FT_Set_Charmap(face_00,charmap);
    globals->increase_x_height = 0;
    local_34 = 0;
  }
  *aglobals = globals;
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_face_globals_new( FT_Face          face,
                       AF_FaceGlobals  *aglobals,
                       AF_Module        module )
  {
    FT_Error        error;
    FT_Memory       memory;
    AF_FaceGlobals  globals = NULL;


    memory = face->memory;

    /* we allocate an AF_FaceGlobals structure together */
    /* with the glyph_styles array                      */
    if ( FT_ALLOC( globals,
                   sizeof ( *globals ) +
                     (FT_ULong)face->num_glyphs * sizeof ( FT_UShort ) ) )
      goto Exit;

    globals->face                      = face;
    globals->glyph_count               = face->num_glyphs;
    /* right after the globals structure come the glyph styles */
    globals->glyph_styles              = (FT_UShort*)( globals + 1 );
    globals->module                    = module;
    globals->stem_darkening_for_ppem   = 0;
    globals->darken_x                  = 0;
    globals->darken_y                  = 0;
    globals->standard_vertical_width   = 0;
    globals->standard_horizontal_width = 0;
    globals->scale_down_factor         = 0;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    globals->hb_font = hb_ft_font_create( face, NULL );
    globals->hb_buf  = hb_buffer_create();
#endif

    error = af_face_globals_compute_style_coverage( globals );
    if ( error )
    {
      af_face_globals_free( globals );
      globals = NULL;
    }
    else
      globals->increase_x_height = AF_PROP_INCREASE_X_HEIGHT_MAX;

  Exit:
    *aglobals = globals;
    return error;
  }